

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opencv_demo.cc
# Opt level: O1

int main(int argc,char **argv)

{
  double dVar1;
  undefined8 uVar2;
  char cVar3;
  int iVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  char *__s1;
  undefined4 *puVar7;
  size_t *__ptr;
  ostream *poVar8;
  long lVar9;
  char *pcVar10;
  String text;
  Size textsize;
  apriltag_detection_t *det;
  int baseline;
  image_u8_t im;
  stringstream ss;
  VideoCapture cap;
  Mat gray;
  Mat frame;
  _InputArray local_3b0;
  int local_390;
  int local_38c;
  int local_388;
  int local_384;
  int local_380;
  int local_37c;
  int local_378;
  int local_374;
  int local_370;
  int local_36c;
  int local_368;
  int local_364;
  int local_360;
  int local_35c;
  int local_358;
  int local_354;
  int local_350;
  int local_34c;
  int local_348;
  int local_344;
  undefined8 local_340;
  undefined8 local_338;
  char *local_330;
  undefined4 *local_328;
  size_t *local_320;
  long local_318;
  long local_310 [2];
  undefined4 local_300;
  undefined4 local_2fc;
  undefined4 local_2f8;
  undefined8 local_2f0;
  char local_2e8 [40];
  undefined4 local_2c0 [2];
  Mat *local_2b8;
  undefined8 uStack_2b0;
  long *local_2a8;
  Mat *pMStack_2a0;
  long local_298 [14];
  ios_base local_228 [264];
  VideoCapture local_120 [48];
  Mat local_f0 [8];
  undefined4 local_e8;
  undefined4 local_e4;
  undefined8 local_e0;
  Mat local_90 [96];
  
  uVar6 = getopt_create();
  getopt_add_bool(uVar6,0x68,"help",0,"Show this help");
  getopt_add_bool(uVar6,100,"debug",1,"Enable debugging output (slow)");
  getopt_add_bool(uVar6,0x71,"quiet",0,"Reduce output");
  getopt_add_string(uVar6,0x66,"family","tag36h11","Tag family to use");
  getopt_add_int(uVar6,0x74,"threads","1","Use this many CPU threads");
  getopt_add_double(uVar6,0x78,"decimate","1.0","Decimate input image by this factor");
  getopt_add_double(uVar6,0x62,"blur","0.0","Apply low-pass blur to input");
  pcVar10 = "Spend more time trying to align edges of tags";
  getopt_add_bool(uVar6,0x30,"refine-edges",1);
  iVar4 = getopt_parse(uVar6,argc,argv);
  if (iVar4 != 0) {
    iVar4 = getopt_get_bool(uVar6);
    if (iVar4 == 0) {
      cv::VideoCapture::VideoCapture(local_120,0,0);
      cVar3 = cv::VideoCapture::isOpened();
      if (cVar3 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Couldn\'t open video capture device",0x22);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x50);
        std::ostream::put(-0x50);
        iVar4 = -1;
        std::ostream::flush();
      }
      else {
        __s1 = (char *)getopt_get_string(uVar6,"family");
        iVar4 = strcmp(__s1,"tag36h11");
        if (iVar4 == 0) {
          local_340 = tag36h11_create();
        }
        else {
          iVar4 = strcmp(__s1,"tag25h9");
          if (iVar4 == 0) {
            local_340 = tag25h9_create();
          }
          else {
            iVar4 = strcmp(__s1,"tag16h5");
            if (iVar4 == 0) {
              local_340 = tag16h5_create();
            }
            else {
              iVar4 = strcmp(__s1,"tagCircle21h7");
              if (iVar4 == 0) {
                local_340 = tagCircle21h7_create();
              }
              else {
                iVar4 = strcmp(__s1,"tagCircle49h12");
                if (iVar4 == 0) {
                  local_340 = tagCircle49h12_create();
                }
                else {
                  iVar4 = strcmp(__s1,"tagStandard41h12");
                  if (iVar4 == 0) {
                    local_340 = tagStandard41h12_create();
                  }
                  else {
                    iVar4 = strcmp(__s1,"tagStandard52h13");
                    if (iVar4 != 0) {
                      puts("Unrecognized tag family name. Use e.g. \"tag36h11\".");
                      exit(-1);
                    }
                    local_340 = tagStandard52h13_create();
                  }
                }
              }
            }
          }
        }
        local_330 = __s1;
        puVar7 = (undefined4 *)apriltag_detector_create();
        apriltag_detector_add_family_bits(puVar7,local_340,2);
        dVar1 = (double)getopt_get_double(uVar6,"decimate");
        puVar7[1] = (float)dVar1;
        dVar1 = (double)getopt_get_double(uVar6,"blur");
        puVar7[2] = (float)dVar1;
        uVar5 = getopt_get_int(uVar6,"threads");
        *puVar7 = uVar5;
        uVar5 = getopt_get_bool(uVar6,"debug");
        puVar7[6] = uVar5;
        uVar5 = getopt_get_bool(uVar6,"refine-edges");
        puVar7[3] = uVar5;
        local_338 = uVar6;
        cv::Mat::Mat(local_90);
        cv::Mat::Mat(local_f0);
        local_328 = puVar7;
        do {
          cv::VideoCapture::operator>>(local_120,local_90);
          local_298[0] = 0;
          local_2a8 = (long *)CONCAT44(local_2a8._4_4_,0x1010000);
          local_3b0.sz.width = 0;
          local_3b0.sz.height = 0;
          local_3b0.flags = 0x2010000;
          local_3b0.obj = local_f0;
          pMStack_2a0 = local_90;
          cv::cvtColor((cv *)&local_2a8,&local_3b0,(_OutputArray *)0x6,0,(int)pcVar10);
          local_300 = local_e4;
          local_2fc = local_e8;
          local_2f8 = local_e4;
          local_2f0 = local_e0;
          __ptr = (size_t *)apriltag_detector_detect(puVar7,&local_300);
          if (__ptr == (size_t *)0x0) {
            __assert_fail("za != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/./common/zarray.h"
                          ,0x84,"int zarray_size(const zarray_t *)");
          }
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)__ptr[1]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," tags detected",0xe);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          if (0 < (int)__ptr[1]) {
            lVar9 = 0;
            local_320 = __ptr;
            do {
              local_318 = lVar9;
              memcpy(local_310,(void *)(*local_320 * lVar9 + local_320[2]),*local_320);
              lVar9 = local_310[0];
              local_3b0.sz.width = 0;
              local_3b0.sz.height = 0;
              local_3b0.flags = 0x3010000;
              local_348 = (int)*(double *)(local_310[0] + 0x30);
              local_344 = (int)*(double *)(local_310[0] + 0x38);
              local_350 = (int)*(double *)(local_310[0] + 0x40);
              local_34c = (int)*(double *)(local_310[0] + 0x48);
              local_2a8 = (long *)0x0;
              pMStack_2a0 = (Mat *)0x406fe00000000000;
              local_298[0] = 0;
              local_298[1] = 0;
              local_3b0.obj = local_90;
              cv::line(&local_3b0,&local_348,&local_350,(stringstream *)&local_2a8,2,8,0);
              local_3b0.sz.width = 0;
              local_3b0.sz.height = 0;
              local_3b0.flags = 0x3010000;
              local_358 = (int)*(double *)(lVar9 + 0x30);
              local_354 = (int)*(double *)(lVar9 + 0x38);
              local_360 = (int)*(double *)(lVar9 + 0x60);
              local_35c = (int)*(double *)(lVar9 + 0x68);
              local_2a8 = (long *)0x0;
              pMStack_2a0 = (Mat *)0x0;
              local_298[0] = 0x406fe00000000000;
              local_298[1] = 0;
              local_3b0.obj = local_90;
              cv::line(&local_3b0,&local_358,&local_360,(stringstream *)&local_2a8,2,8,0);
              local_3b0.sz.width = 0;
              local_3b0.sz.height = 0;
              local_3b0.flags = 0x3010000;
              local_368 = (int)*(double *)(lVar9 + 0x40);
              local_364 = (int)*(double *)(lVar9 + 0x48);
              local_370 = (int)*(double *)(lVar9 + 0x50);
              local_36c = (int)*(double *)(lVar9 + 0x58);
              local_2a8 = (long *)0x406fe00000000000;
              pMStack_2a0 = (Mat *)0x0;
              local_298[0] = 0;
              local_298[1] = 0;
              local_3b0.obj = local_90;
              cv::line(&local_3b0,&local_368,&local_370,(stringstream *)&local_2a8,2,8,0);
              local_3b0.sz.width = 0;
              local_3b0.sz.height = 0;
              local_3b0.flags = 0x3010000;
              local_378 = (int)*(double *)(lVar9 + 0x50);
              local_374 = (int)*(double *)(lVar9 + 0x58);
              local_380 = (int)*(double *)(lVar9 + 0x60);
              local_37c = (int)*(double *)(lVar9 + 0x68);
              local_2a8 = (long *)0x406fe00000000000;
              pMStack_2a0 = (Mat *)0x0;
              local_298[0] = 0;
              local_298[1] = 0;
              local_3b0.obj = local_90;
              cv::line(&local_3b0,&local_378,&local_380,(stringstream *)&local_2a8,2,8,0);
              std::__cxx11::stringstream::stringstream((stringstream *)&local_2a8);
              std::ostream::operator<<((ostream *)local_298,*(int *)(lVar9 + 8));
              std::__cxx11::stringbuf::str();
              cv::getTextSize((string *)&local_388,(int)&local_3b0,1.0,6,(int *)0x2);
              uStack_2b0 = 0;
              local_2c0[0] = 0x3010000;
              local_2b8 = local_90;
              local_390 = (int)(*(double *)(lVar9 + 0x20) - (double)(local_388 / 2));
              local_38c = (int)((double)(local_384 / 2) + *(double *)(lVar9 + 0x28));
              local_2e8[0] = '\0';
              local_2e8[1] = '\0';
              local_2e8[2] = '\0';
              local_2e8[3] = '\0';
              local_2e8[4] = '\0';
              local_2e8[5] = -0x20;
              local_2e8[6] = 'o';
              local_2e8[7] = '@';
              local_2e8[8] = '\0';
              local_2e8[9] = '\0';
              local_2e8[10] = '\0';
              local_2e8[0xb] = '\0';
              local_2e8[0xc] = '\0';
              local_2e8[0xd] = ' ';
              local_2e8[0xe] = 'c';
              local_2e8[0xf] = '@';
              local_2e8[0x10] = '\0';
              local_2e8[0x11] = '\0';
              local_2e8[0x12] = '\0';
              local_2e8[0x13] = '\0';
              local_2e8[0x14] = '\0';
              local_2e8[0x15] = '\0';
              local_2e8[0x16] = '\0';
              local_2e8[0x17] = '\0';
              local_2e8[0x18] = '\0';
              local_2e8[0x19] = '\0';
              local_2e8[0x1a] = '\0';
              local_2e8[0x1b] = '\0';
              local_2e8[0x1c] = '\0';
              local_2e8[0x1d] = '\0';
              local_2e8[0x1e] = '\0';
              local_2e8[0x1f] = '\0';
              pcVar10 = local_2e8;
              cv::putText(0,local_2c0,&local_3b0,&local_390,6,pcVar10,2,8,0);
              if ((Size *)CONCAT44(local_3b0._4_4_,local_3b0.flags) != &local_3b0.sz) {
                operator_delete((undefined1 *)CONCAT44(local_3b0._4_4_,local_3b0.flags),
                                (long)local_3b0.sz + 1);
              }
              std::__cxx11::stringstream::~stringstream((stringstream *)&local_2a8);
              std::ios_base::~ios_base(local_228);
              lVar9 = local_318 + 1;
              __ptr = local_320;
            } while (lVar9 < (int)local_320[1]);
          }
          if ((void *)__ptr[2] != (void *)0x0) {
            free((void *)__ptr[2]);
          }
          *__ptr = 0;
          __ptr[1] = 0;
          __ptr[2] = 0;
          free(__ptr);
          local_2a8 = local_298;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"Tag Detections","");
          puVar7 = local_328;
          local_3b0.sz.width = 0;
          local_3b0.sz.height = 0;
          local_3b0.flags = 0x1010000;
          local_3b0.obj = local_90;
          cv::imshow((string *)&local_2a8,&local_3b0);
          if (local_2a8 != local_298) {
            operator_delete(local_2a8,local_298[0] + 1);
          }
          iVar4 = cv::waitKey(0x1e);
        } while (iVar4 < 0);
        apriltag_detector_destroy(puVar7);
        pcVar10 = local_330;
        uVar2 = local_338;
        uVar6 = local_340;
        iVar4 = strcmp(local_330,"tag36h11");
        if (iVar4 == 0) {
          tag36h11_destroy(uVar6);
        }
        else {
          iVar4 = strcmp(pcVar10,"tag25h9");
          if (iVar4 == 0) {
            tag25h9_destroy(uVar6);
          }
          else {
            iVar4 = strcmp(pcVar10,"tag16h5");
            if (iVar4 == 0) {
              tag16h5_destroy(uVar6);
            }
            else {
              iVar4 = strcmp(pcVar10,"tagCircle21h7");
              if (iVar4 == 0) {
                tagCircle21h7_destroy(uVar6);
              }
              else {
                iVar4 = strcmp(pcVar10,"tagCircle49h12");
                if (iVar4 == 0) {
                  tagCircle49h12_destroy(uVar6);
                }
                else {
                  iVar4 = strcmp(pcVar10,"tagStandard41h12");
                  if (iVar4 == 0) {
                    tagStandard41h12_destroy(uVar6);
                  }
                  else {
                    iVar4 = strcmp(pcVar10,"tagStandard52h13");
                    if (iVar4 == 0) {
                      tagStandard52h13_destroy(uVar6);
                    }
                  }
                }
              }
            }
          }
        }
        getopt_destroy(uVar2);
        cv::Mat::~Mat(local_f0);
        cv::Mat::~Mat(local_90);
        iVar4 = 0;
      }
      cv::VideoCapture::~VideoCapture(local_120);
      return iVar4;
    }
  }
  printf("Usage: %s [options]\n",*argv);
  getopt_do_usage();
  exit(0);
}

Assistant:

int main(int argc, char *argv[])
{
    getopt_t *getopt = getopt_create();

    getopt_add_bool(getopt, 'h', "help", 0, "Show this help");
    getopt_add_bool(getopt, 'd', "debug", 1, "Enable debugging output (slow)");
    getopt_add_bool(getopt, 'q', "quiet", 0, "Reduce output");
    getopt_add_string(getopt, 'f', "family", "tag36h11", "Tag family to use");
    getopt_add_int(getopt, 't', "threads", "1", "Use this many CPU threads");
    getopt_add_double(getopt, 'x', "decimate", "1.0", "Decimate input image by this factor");
    getopt_add_double(getopt, 'b', "blur", "0.0", "Apply low-pass blur to input");
    getopt_add_bool(getopt, '0', "refine-edges", 1, "Spend more time trying to align edges of tags");

    if (!getopt_parse(getopt, argc, argv, 1) ||
            getopt_get_bool(getopt, "help")) {
        printf("Usage: %s [options]\n", argv[0]);
        getopt_do_usage(getopt);
        exit(0);
    }

    // Initialize camera
    VideoCapture cap(0);
    if (!cap.isOpened()) {
        cerr << "Couldn't open video capture device" << endl;
        return -1;
    }

    // Initialize tag detector with options
    apriltag_family_t *tf = NULL;
    const char *famname = getopt_get_string(getopt, "family");
    if (!strcmp(famname, "tag36h11")) {
        tf = tag36h11_create();
    } else if (!strcmp(famname, "tag25h9")) {
        tf = tag25h9_create();
    } else if (!strcmp(famname, "tag16h5")) {
        tf = tag16h5_create();
    } else if (!strcmp(famname, "tagCircle21h7")) {
        tf = tagCircle21h7_create();
    } else if (!strcmp(famname, "tagCircle49h12")) {
        tf = tagCircle49h12_create();
    } else if (!strcmp(famname, "tagStandard41h12")) {
        tf = tagStandard41h12_create();
    } else if (!strcmp(famname, "tagStandard52h13")) {
        tf = tagStandard52h13_create();
    } else {
        printf("Unrecognized tag family name. Use e.g. \"tag36h11\".\n");
        exit(-1);
    }


    apriltag_detector_t *td = apriltag_detector_create();
    apriltag_detector_add_family(td, tf);
    td->quad_decimate = getopt_get_double(getopt, "decimate");
    td->quad_sigma = getopt_get_double(getopt, "blur");
    td->nthreads = getopt_get_int(getopt, "threads");
    td->debug = getopt_get_bool(getopt, "debug");
    td->refine_edges = getopt_get_bool(getopt, "refine-edges");

    Mat frame, gray;
    while (true) {
        cap >> frame;
        cvtColor(frame, gray, COLOR_BGR2GRAY);

        // Make an image_u8_t header for the Mat data
        image_u8_t im = { .width = gray.cols,
            .height = gray.rows,
            .stride = gray.cols,
            .buf = gray.data
        };

        zarray_t *detections = apriltag_detector_detect(td, &im);
        cout << zarray_size(detections) << " tags detected" << endl;

        // Draw detection outlines
        for (int i = 0; i < zarray_size(detections); i++) {
            apriltag_detection_t *det;
            zarray_get(detections, i, &det);
            line(frame, Point(det->p[0][0], det->p[0][1]),
                     Point(det->p[1][0], det->p[1][1]),
                     Scalar(0, 0xff, 0), 2);
            line(frame, Point(det->p[0][0], det->p[0][1]),
                     Point(det->p[3][0], det->p[3][1]),
                     Scalar(0, 0, 0xff), 2);
            line(frame, Point(det->p[1][0], det->p[1][1]),
                     Point(det->p[2][0], det->p[2][1]),
                     Scalar(0xff, 0, 0), 2);
            line(frame, Point(det->p[2][0], det->p[2][1]),
                     Point(det->p[3][0], det->p[3][1]),
                     Scalar(0xff, 0, 0), 2);

            stringstream ss;
            ss << det->id;
            String text = ss.str();
            int fontface = FONT_HERSHEY_SCRIPT_SIMPLEX;
            double fontscale = 1.0;
            int baseline;
            Size textsize = getTextSize(text, fontface, fontscale, 2,
                                            &baseline);
            putText(frame, text, Point(det->c[0]-textsize.width/2,
                                       det->c[1]+textsize.height/2),
                    fontface, fontscale, Scalar(0xff, 0x99, 0), 2);
        }
        zarray_destroy(detections);

        imshow("Tag Detections", frame);
        if (waitKey(30) >= 0)
            break;
    }

    apriltag_detector_destroy(td);

    if (!strcmp(famname, "tag36h11")) {
        tag36h11_destroy(tf);
    } else if (!strcmp(famname, "tag25h9")) {
        tag25h9_destroy(tf);
    } else if (!strcmp(famname, "tag16h5")) {
        tag16h5_destroy(tf);
    } else if (!strcmp(famname, "tagCircle21h7")) {
        tagCircle21h7_destroy(tf);
    } else if (!strcmp(famname, "tagCircle49h12")) {
        tagCircle49h12_destroy(tf);
    } else if (!strcmp(famname, "tagStandard41h12")) {
        tagStandard41h12_destroy(tf);
    } else if (!strcmp(famname, "tagStandard52h13")) {
        tagStandard52h13_destroy(tf);
    }


    getopt_destroy(getopt);

    return 0;
}